

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O3

uint64_t __thiscall kaitai::kstream::read_bits_int_be(kstream *this,int n)

{
  int i;
  ulong uVar1;
  uint64_t uVar2;
  runtime_error *this_00;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint8_t buf [8];
  byte local_20 [8];
  
  iVar5 = n - this->m_bits_left;
  uVar3 = -iVar5 & 7;
  this->m_bits_left = uVar3;
  if (iVar5 < 1) {
    uVar4 = this->m_bits;
    uVar2 = uVar4 >> ((byte)-iVar5 & 0x3f);
  }
  else {
    if (0x3f < iVar5 - 1U) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"read_bits_int_be: more than 8 bytes requested");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::read((char *)this->m_io,(long)local_20);
    uVar1 = 0;
    uVar4 = 0;
    do {
      uVar4 = (ulong)local_20[uVar1] | uVar4 << 8;
      uVar1 = uVar1 + 1;
    } while ((iVar5 - 1U >> 3) + 1 != uVar1);
    uVar3 = this->m_bits_left;
    uVar1 = 0;
    if (iVar5 < 0x40) {
      uVar1 = this->m_bits << ((byte)iVar5 & 0x3f);
    }
    uVar2 = uVar1 | uVar4 >> ((byte)uVar3 & 0x3f);
    this->m_bits = uVar4;
  }
  this->m_bits = ~(-1L << ((byte)uVar3 & 0x3f)) & uVar4;
  return uVar2;
}

Assistant:

uint64_t kaitai::kstream::read_bits_int_be(int n) {
    uint64_t res = 0;

    int bits_needed = n - m_bits_left;
    m_bits_left = -bits_needed & 7; // `-bits_needed mod 8`

    if (bits_needed > 0) {
        // 1 bit  => 1 byte
        // 8 bits => 1 byte
        // 9 bits => 2 bytes
        int bytes_needed = ((bits_needed - 1) / 8) + 1; // `ceil(bits_needed / 8)`
        if (bytes_needed > 8)
            throw std::runtime_error("read_bits_int_be: more than 8 bytes requested");
        uint8_t buf[8];
        m_io->read(reinterpret_cast<char *>(buf), bytes_needed);
        for (int i = 0; i < bytes_needed; i++) {
            res = res << 8 | buf[i];
        }

        uint64_t new_bits = res;
        res = res >> m_bits_left | (bits_needed < 64 ? m_bits << bits_needed : 0); // avoid undefined behavior of `x << 64`
        m_bits = new_bits; // will be masked at the end of the function
    } else {
        res = m_bits >> -bits_needed; // shift unneeded bits out
    }

    uint64_t mask = (UINT64_C(1) << m_bits_left) - 1; // `m_bits_left` is in range 0..7, so `(1 << 64)` does not have to be considered
    m_bits &= mask;

    return res;
}